

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O0

void __thiscall
ASDCP::MXF::WaveAudioDescriptor::WaveAudioDescriptor(WaveAudioDescriptor *this,Dictionary *d)

{
  byte_t *value;
  UL local_48;
  Dictionary *local_18;
  Dictionary *d_local;
  WaveAudioDescriptor *this_local;
  
  local_18 = d;
  d_local = (Dictionary *)this;
  GenericSoundEssenceDescriptor::GenericSoundEssenceDescriptor
            (&this->super_GenericSoundEssenceDescriptor,d);
  (this->super_GenericSoundEssenceDescriptor).super_FileDescriptor.super_GenericDescriptor.
  super_InterchangeObject.super_KLVPacket._vptr_KLVPacket =
       (_func_int **)&PTR__WaveAudioDescriptor_0033a770;
  this->BlockAlign = 0;
  optional_property<unsigned_char>::optional_property(&this->SequenceOffset);
  this->AvgBps = 0;
  optional_property<ASDCP::UL>::optional_property(&this->ChannelAssignment);
  if ((this->super_GenericSoundEssenceDescriptor).super_FileDescriptor.super_GenericDescriptor.
      super_InterchangeObject.m_Dict != (Dictionary *)0x0) {
    value = Dictionary::ul((this->super_GenericSoundEssenceDescriptor).super_FileDescriptor.
                           super_GenericDescriptor.super_InterchangeObject.m_Dict,
                           MDD_WaveAudioDescriptor);
    UL::UL(&local_48,value);
    UL::operator=(&(this->super_GenericSoundEssenceDescriptor).super_FileDescriptor.
                   super_GenericDescriptor.super_InterchangeObject.super_KLVPacket.m_UL,&local_48);
    UL::~UL(&local_48);
    return;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                ,0x658,"ASDCP::MXF::WaveAudioDescriptor::WaveAudioDescriptor(const Dictionary *)");
}

Assistant:

WaveAudioDescriptor::WaveAudioDescriptor(const Dictionary* d) : GenericSoundEssenceDescriptor(d), BlockAlign(0), AvgBps(0)
{
  assert(m_Dict);
  m_UL = m_Dict->ul(MDD_WaveAudioDescriptor);
}